

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

void ScanAnalyse(fstream *file)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  mapped_type *pmVar6;
  long *plVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  undefined8 *puVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  string __str_3;
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string str;
  ofstream resultFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  key_type local_2e0;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  size_type local_280;
  ulong local_278;
  string local_270;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,"C:\\Code\\C\\clion\\LR1\\token.txt",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"into scan...",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  ScanByChar_abi_cxx11_(&local_270,file);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0);
  if ((int)(uint)local_270._M_string_length < 1) {
LAB_0010c87d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  local_278 = (ulong)((uint)local_270._M_string_length & 0x7fffffff);
  uVar18 = 0;
  local_280 = local_270._M_string_length;
LAB_0010b4e1:
  bVar2 = local_270._M_dataplus._M_p[(int)uVar18];
  std::__cxx11::string::_M_replace((ulong)&local_2e0,0,(char *)local_2e0._M_string_length,0x10e0dd);
  if (Space[0] == bVar2) {
LAB_0010b786:
    uVar18 = uVar18 + 1;
  }
  else {
    uVar21 = 0;
    do {
      uVar14 = uVar21;
      if (uVar14 == 3) break;
      uVar21 = uVar14 + 1;
    } while (Space[uVar14 + 1] != bVar2);
    if (uVar14 < 3) goto LAB_0010b786;
    if (Divide[0] == bVar2) {
LAB_0010b568:
      std::__cxx11::string::push_back((char)&local_2e0);
      local_2a0[0] = local_290;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a0,local_2e0._M_dataplus._M_p,
                 (char *)(local_2e0._M_string_length + (long)local_2e0._M_dataplus._M_p));
      std::__cxx11::string::append((char *)local_2a0);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&relatemap_abi_cxx11_,&local_2e0);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_2a0,(ulong)(pmVar6->_M_dataplus)._M_p);
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_2b0 = *plVar11;
        lStack_2a8 = plVar7[3];
        local_2c0 = &local_2b0;
      }
      else {
        local_2b0 = *plVar11;
        local_2c0 = (long *)*plVar7;
      }
      local_2b8 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c0);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_300.field_2._M_allocated_capacity = *psVar12;
        local_300.field_2._8_8_ = plVar7[3];
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar12;
        local_300._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_300._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_300._M_dataplus._M_p,
                          local_300._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0);
      }
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0]);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&sortmap_abi_cxx11_,&local_2e0);
      if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&list1,
                   (iterator)
                   list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,pmVar9);
      }
      else {
        *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *pmVar9;
        list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"NONE","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &list2_abi_cxx11_,&local_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,local_2e0._M_dataplus._M_p,
                          local_2e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      goto LAB_0010b786;
    }
    uVar21 = 0;
    do {
      uVar14 = uVar21;
      if (uVar14 == 4) break;
      uVar21 = uVar14 + 1;
    } while (Divide[uVar14 + 1] != bVar2);
    if (uVar14 < 4) goto LAB_0010b568;
    if (Operate[0] == bVar2) {
LAB_0010b7d3:
      std::__cxx11::string::push_back((char)&local_2e0);
      bVar23 = true;
      if (Operate[0] != local_270._M_dataplus._M_p[(long)(int)uVar18 + 1]) {
        uVar21 = 0;
        do {
          uVar14 = uVar21;
          if (uVar14 == 3) break;
          uVar21 = uVar14 + 1;
        } while (Operate[uVar14 + 1] != local_270._M_dataplus._M_p[(long)(int)uVar18 + 1]);
        bVar23 = uVar14 < 3;
      }
      uVar16 = uVar18 + 1;
      if (!(bool)(bVar23 ^ 1U | (int)local_280 <= (int)(uVar18 + 1))) {
        std::__cxx11::string::push_back((char)&local_2e0);
        uVar16 = uVar18 + 2;
      }
      uVar18 = uVar16;
      local_2a0[0] = local_290;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a0,local_2e0._M_dataplus._M_p,
                 (char *)(local_2e0._M_string_length + (long)local_2e0._M_dataplus._M_p));
      std::__cxx11::string::append((char *)local_2a0);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&relatemap_abi_cxx11_,&local_2e0);
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)local_2a0,(ulong)(pmVar6->_M_dataplus)._M_p)
      ;
      local_2c0 = &local_2b0;
      plVar7 = puVar10 + 2;
      if ((long *)*puVar10 == plVar7) {
        local_2b0 = *plVar7;
        lStack_2a8 = puVar10[3];
      }
      else {
        local_2b0 = *plVar7;
        local_2c0 = (long *)*puVar10;
      }
      local_2b8 = puVar10[1];
      *puVar10 = plVar7;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_300.field_2._M_allocated_capacity = *psVar12;
        local_300.field_2._8_8_ = puVar10[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar12;
        local_300._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_300._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_300._M_dataplus._M_p,
                          local_300._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0);
      }
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0]);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&sortmap_abi_cxx11_,&local_2e0);
      if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&list1,
                   (iterator)
                   list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,pmVar9);
      }
      else {
        *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *pmVar9;
        list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"NONE","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &list2_abi_cxx11_,&local_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,local_2e0._M_dataplus._M_p,
                          local_2e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    }
    else {
      uVar21 = 0;
      do {
        uVar14 = uVar21;
        if (uVar14 == 3) break;
        uVar21 = uVar14 + 1;
      } while (Operate[uVar14 + 1] != bVar2);
      if (uVar14 < 3) goto LAB_0010b7d3;
      if ((byte)(bVar2 - 0x30) < 10) {
        std::__cxx11::string::push_back((char)&local_2e0);
        bVar23 = true;
        uVar21 = (ulong)uVar18;
        do {
          uVar14 = uVar21;
          lVar20 = (long)(int)uVar14;
          bVar2 = local_270._M_dataplus._M_p[lVar20 + 1];
          bVar24 = true;
          if (Space[0] != bVar2) {
            uVar21 = 0;
            do {
              uVar13 = uVar21;
              if (uVar13 == 3) break;
              uVar21 = uVar13 + 1;
            } while (Space[uVar13 + 1] != bVar2);
            bVar24 = uVar13 < 3;
          }
          uVar21 = lVar20 + 1;
          uVar18 = (uint)uVar21;
          if ((((int)local_280 <= (int)uVar18) || (bVar24)) || (!bVar23)) goto LAB_0010bd4e;
          std::__cxx11::string::push_back((char)&local_2e0);
          if (((9 < (byte)(bVar2 - 0x30)) && (bVar2 != 0x2e)) && ((bVar2 & 0xdf) != 0x45)) {
            bVar23 = false;
            std::__cxx11::string::_M_erase
                      ((ulong)&local_2e0,(ulong)(local_2e0._M_string_length + -1));
            uVar21 = uVar14 & 0xffffffff;
          }
        } while( true );
      }
      if (bVar2 == 0x5f || (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) {
        std::__cxx11::string::push_back((char)&local_2e0);
        lVar20 = (long)(int)(uVar18 + 1);
        do {
          bVar2 = local_270._M_dataplus._M_p[lVar20];
          bVar23 = true;
          if (Space[0] != bVar2) {
            uVar21 = 0;
            do {
              uVar14 = uVar21;
              if (uVar14 == 3) break;
              uVar21 = uVar14 + 1;
            } while (Space[uVar14 + 1] != bVar2);
            bVar23 = uVar14 < 3;
          }
          lVar1 = lVar20 + 1;
          lVar22 = lVar1;
          if (((bVar23) || ((long)local_278 <= lVar1)) ||
             ((9 < (byte)(bVar2 - 0x30) &&
              ((bVar2 != 0x5f && (lVar22 = lVar20, 0x19 < (byte)((bVar2 & 0xdf) + 0xbf)))))))
          goto LAB_0010c154;
          std::__cxx11::string::push_back((char)&local_2e0);
          lVar20 = lVar1;
        } while( true );
      }
      std::__cxx11::string::push_back((char)&local_2e0);
      cVar15 = local_270._M_dataplus._M_p[(long)(int)uVar18 + 1];
      std::__cxx11::string::push_back((char)&local_2e0);
      uVar18 = uVar18 + 2;
      if ((int)uVar18 < (int)local_280) {
        cVar15 = (cVar15 == '*') + '\x01';
        lVar20 = (long)(int)uVar18;
        do {
          cVar3 = local_270._M_dataplus._M_p[lVar20];
          std::__cxx11::string::push_back((char)&local_2e0);
          if (cVar15 == '\x03') {
            if ((cVar3 != '*') && (cVar15 = '\x04', cVar3 != '/')) {
              cVar15 = '\x02';
            }
          }
          else if ((cVar15 == '\x02') && (cVar3 == '*')) {
            cVar15 = '\x03';
          }
          uVar18 = uVar18 + 1;
        } while ((lVar20 + 1 < (long)local_278) && (lVar20 = lVar20 + 1, cVar15 != '\x04'));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"annotation:",0xb);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_2e0._M_dataplus._M_p,
                          local_2e0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
  }
  goto LAB_0010b78c;
LAB_0010bd4e:
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,local_2e0._M_dataplus._M_p,
             (char *)(local_2e0._M_string_length + (long)local_2e0._M_dataplus._M_p));
  std::__cxx11::string::append((char *)local_2a0);
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)local_2a0,(ulong)local_2e0._M_dataplus._M_p);
  local_2c0 = &local_2b0;
  plVar7 = puVar10 + 2;
  if ((long *)*puVar10 == plVar7) {
    local_2b0 = *plVar7;
    lStack_2a8 = puVar10[3];
  }
  else {
    local_2b0 = *plVar7;
    local_2c0 = (long *)*puVar10;
  }
  local_2b8 = puVar10[1];
  *puVar10 = plVar7;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  psVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_300.field_2._M_allocated_capacity = *psVar12;
    local_300.field_2._8_8_ = puVar10[3];
  }
  else {
    local_300.field_2._M_allocated_capacity = *psVar12;
    local_300._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_300._M_string_length = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_300._M_dataplus._M_p,local_300._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0]);
  }
  local_300._M_dataplus._M_p._0_4_ = 9;
  if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      == list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&list1,(iterator)
                      list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,(int *)&local_300);
  }
  else {
    *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         9;
    list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"iConst",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
  if (table_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      table_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar21 = 0;
    bVar23 = false;
    do {
      if (((char *)local_2e0._M_string_length ==
           (char *)table_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length) &&
         (((char *)local_2e0._M_string_length == (char *)0x0 ||
          (iVar4 = bcmp(local_2e0._M_dataplus._M_p,
                        table_abi_cxx11_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_dataplus._M_p,
                        local_2e0._M_string_length), iVar4 == 0)))) {
        uVar16 = 1;
        if (9 < uVar21) {
          uVar17 = 4;
          uVar14 = uVar21;
          do {
            uVar16 = uVar17;
            uVar19 = (uint)uVar14;
            if (uVar19 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_0010c06b;
            }
            if (uVar19 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_0010c06b;
            }
            if (uVar19 < 10000) goto LAB_0010c06b;
            uVar14 = (uVar14 & 0xffffffff) / 10000;
            uVar17 = uVar16 + 4;
          } while (99999 < uVar19);
          uVar16 = uVar16 + 1;
        }
LAB_0010c06b:
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar16);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_300._M_dataplus._M_p,uVar16,(uint)uVar21);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &list2_abi_cxx11_,&local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p);
        }
        bVar23 = true;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)((long)table_abi_cxx11_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)table_abi_cxx11_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
    if (bVar23) goto LAB_0010b78c;
  }
  uVar16 = -sortNumber;
  if (0 < sortNumber) {
    uVar16 = sortNumber;
  }
  uVar17 = 1;
  if (9 < uVar16) {
    uVar21 = (ulong)uVar16;
    uVar19 = 4;
    do {
      uVar17 = uVar19;
      uVar5 = (uint)uVar21;
      if (uVar5 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_0010c78a;
      }
      if (uVar5 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_0010c78a;
      }
      if (uVar5 < 10000) goto LAB_0010c78a;
      uVar21 = uVar21 / 10000;
      uVar19 = uVar17 + 4;
    } while (99999 < uVar5);
    uVar17 = uVar17 + 1;
  }
LAB_0010c78a:
  uVar19 = (uint)sortNumber >> 0x1f;
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar17 - (char)(sortNumber >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_300._M_dataplus._M_p + uVar19,uVar17,uVar16)
  ;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list2_abi_cxx11_,
             &local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  sortNumber = sortNumber + 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&table_abi_cxx11_,&local_2e0);
LAB_0010b78c:
  if ((int)local_280 <= (int)uVar18) goto LAB_0010c87d;
  goto LAB_0010b4e1;
LAB_0010c154:
  uVar18 = (uint)lVar22;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,local_2e0._M_dataplus._M_p,
             (char *)(local_2e0._M_string_length + (long)local_2e0._M_dataplus._M_p));
  bVar23 = IsKeyword(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_2a0[0] = local_290;
  if (bVar23) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a0,local_2e0._M_dataplus._M_p,
               (char *)(local_2e0._M_string_length + (long)local_2e0._M_dataplus._M_p));
    std::__cxx11::string::append((char *)local_2a0);
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)local_2a0,(ulong)local_2e0._M_dataplus._M_p);
    local_2c0 = &local_2b0;
    plVar7 = puVar10 + 2;
    if ((long *)*puVar10 == plVar7) {
      local_2b0 = *plVar7;
      lStack_2a8 = puVar10[3];
    }
    else {
      local_2b0 = *plVar7;
      local_2c0 = (long *)*puVar10;
    }
    local_2b8 = puVar10[1];
    *puVar10 = plVar7;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_300.field_2._M_allocated_capacity = *psVar12;
      local_300.field_2._8_8_ = puVar10[3];
    }
    else {
      local_300.field_2._M_allocated_capacity = *psVar12;
      local_300._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_300._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_300._M_dataplus._M_p,local_300._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0);
    }
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0]);
    }
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&sortmap_abi_cxx11_,&local_2e0);
    if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&list1,
                 (iterator)
                 list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_finish,pmVar9);
    }
    else {
      *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = *pmVar9;
      list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1;
    }
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"NONE","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &list2_abi_cxx11_,&local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_2e0._M_dataplus._M_p,local_2e0._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a0,local_2e0._M_dataplus._M_p,
               (char *)(local_2e0._M_string_length + (long)local_2e0._M_dataplus._M_p));
    std::__cxx11::string::append((char *)local_2a0);
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)local_2a0,(ulong)local_2e0._M_dataplus._M_p);
    local_2c0 = &local_2b0;
    plVar7 = puVar10 + 2;
    if ((long *)*puVar10 == plVar7) {
      local_2b0 = *plVar7;
      lStack_2a8 = puVar10[3];
    }
    else {
      local_2b0 = *plVar7;
      local_2c0 = (long *)*puVar10;
    }
    local_2b8 = puVar10[1];
    *puVar10 = plVar7;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_300.field_2._M_allocated_capacity = *psVar12;
      local_300.field_2._8_8_ = puVar10[3];
    }
    else {
      local_300.field_2._M_allocated_capacity = *psVar12;
      local_300._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_300._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_300._M_dataplus._M_p,local_300._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0);
    }
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0]);
    }
    local_300._M_dataplus._M_p._0_4_ = 1;
    if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&list1,(iterator)
                        list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,(int *)&local_300);
    }
    else {
      *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = 1;
      list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"id",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
    if (table_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        table_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar21 = 0;
      bVar23 = false;
      do {
        if (((char *)local_2e0._M_string_length ==
             (char *)table_abi_cxx11_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length) &&
           (((char *)local_2e0._M_string_length == (char *)0x0 ||
            (iVar4 = bcmp(local_2e0._M_dataplus._M_p,
                          table_abi_cxx11_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_dataplus._M_p,
                          local_2e0._M_string_length), iVar4 == 0)))) {
          uVar16 = 1;
          if (9 < uVar21) {
            uVar17 = 4;
            uVar14 = uVar21;
            do {
              uVar16 = uVar17;
              uVar19 = (uint)uVar14;
              if (uVar19 < 100) {
                uVar16 = uVar16 - 2;
                goto LAB_0010c616;
              }
              if (uVar19 < 1000) {
                uVar16 = uVar16 - 1;
                goto LAB_0010c616;
              }
              if (uVar19 < 10000) goto LAB_0010c616;
              uVar14 = (uVar14 & 0xffffffff) / 10000;
              uVar17 = uVar16 + 4;
            } while (99999 < uVar19);
            uVar16 = uVar16 + 1;
          }
LAB_0010c616:
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar16);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_300._M_dataplus._M_p,uVar16,(uint)uVar21);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &list2_abi_cxx11_,&local_300);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p);
          }
          bVar23 = true;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (ulong)((long)table_abi_cxx11_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)table_abi_cxx11_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
      if (bVar23) goto LAB_0010b78c;
    }
    uVar16 = -sortNumber;
    if (0 < sortNumber) {
      uVar16 = sortNumber;
    }
    uVar17 = 1;
    if (9 < uVar16) {
      uVar21 = (ulong)uVar16;
      uVar19 = 4;
      do {
        uVar17 = uVar19;
        uVar5 = (uint)uVar21;
        if (uVar5 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0010c807;
        }
        if (uVar5 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0010c807;
        }
        if (uVar5 < 10000) goto LAB_0010c807;
        uVar21 = uVar21 / 10000;
        uVar19 = uVar17 + 4;
      } while (99999 < uVar5);
      uVar17 = uVar17 + 1;
    }
LAB_0010c807:
    uVar19 = (uint)sortNumber >> 0x1f;
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar17 - (char)(sortNumber >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_300._M_dataplus._M_p + uVar19,uVar17,uVar16);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &list2_abi_cxx11_,&local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    sortNumber = sortNumber + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&table_abi_cxx11_,&local_2e0);
  }
  goto LAB_0010b78c;
}

Assistant:

void ScanAnalyse(fstream &file) {
    ofstream resultFile("C:\\Code\\C\\clion\\LR1\\token.txt");
    cout << "into scan..." << endl;
    string str = ScanByChar(file);
    int pos = 0;
    int length = str.length();
    char ch;
    string buffer = "";
    int state = 0;
    while (pos < length) {
        ch = str[pos];
        buffer = "";
        if (IsSpace(ch)) { pos++; }
        else if (IsDivide(ch)) {
            buffer += ch;
            pos++;
            cout << buffer + "  <" + relatemap[buffer] + ", _>" << endl;
            list1.push_back(sortmap[buffer]);
            list2.push_back("NONE");
            resultFile << buffer << " ";
            //tokenmap.insert( pair<int,string>(sortmap[buffer],"NONE") );
        } else if (IsOperate(ch)) {
            buffer += ch;
            pos++;
            if (IsOperate(ch = str[pos]) && pos < length) {
                buffer += ch;
                pos++;
            } else {
            }
            cout << buffer + "  <" + relatemap[buffer] + ", _>" << endl;
            list1.push_back(sortmap[buffer]);
            list2.push_back("NONE");
            resultFile << buffer << " ";
            //tokenmap.insert( pair<int,string>(sortmap[buffer],"NONE") );
        } else if (IsDigit(ch)) {
            state = 1;
            buffer += ch;
            pos++;
            bool flag = true;
            while (!IsSpace(ch = str[pos]) && pos < length && flag) {
                buffer += ch;
                switch (state) {
                    case 1:
                        if (IsDigit(ch)) state = 1;
                        else if (ch == '.') state = 2;
                        else if (ch == 'E' || ch == 'e') state = 4;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 2:
                        if (IsDigit(ch)) state = 3;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 3:
                        if (IsDigit(ch)) state = 3;
                        else if (ch == 'E' || ch == 'e') state = 4;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 4:
                        if (ch == '+' || ch == '-') state = 5;
                        else if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 5:
                        if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 6:
                        if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    default:
                        pos--;
                        flag = false;
                        buffer.erase(buffer.end() - 1);
                        cout << "error!" << endl;
                        break;
                }
                pos++;
            }
            cout << buffer + " <CONST," + buffer + ">" << endl;
            list1.push_back(9);
            resultFile << "iConst" << " ";
            bool flag2 = false;
            int i = 0;
            for (i = 0; i < table.size(); i++) {
                if (buffer == table[i]) {
                    list2.push_back(to_string(i));
                    flag2 = true;
                }
            }
            if (!flag2) {
                list2.push_back(to_string(sortNumber));
                sortNumber++;
                table.push_back(buffer);
            }
        } else if (IsLetter(ch) || ch == '_') {
            buffer += ch;
            pos++;
            while (!IsSpace(ch = str[pos++]) && pos < length) {
                if (IsLetter(ch) || ch == '_' || IsDigit(ch)) {
                    buffer += ch;
                } else {
                    //fseek(fp,-1L,SEEK_CUR);
                    //fp.seekg(0,ios::cur);
                    pos--;
                    break;
                }
            }
            if (IsKeyword(buffer)) {
                cout << buffer + " <" + buffer + ",_>" << endl;
                list1.push_back(sortmap[buffer]);
                list2.push_back("NONE");
                resultFile << buffer << " ";
            } else {
                cout << buffer + " <IDN," + buffer + ">" << endl;
                list1.push_back(1);
                resultFile << "id" << " ";
                bool flag = false;
                int i = 0;
                for (i = 0; i < table.size(); i++) {
                    if (buffer == table[i]) {
                        list2.push_back(to_string(i));
                        flag = true;
                    }
                }
                if (!flag) {
                    list2.push_back(to_string(sortNumber));
                    sortNumber++;
                    table.push_back(buffer);
                }
            }
        } else if ("/") {
            state = 1;
            buffer += ch;
            pos++;
            ch = str[pos++];
            buffer += ch;
            if (ch == '*') {
                state = 2;
            }
            while (pos < length && state != 4) {
                ch = str[pos++];
                buffer += ch;
                switch (state) {
                    case 2:
                        if (ch == '*') {
                            state = 3;
                        } else {}
                        break;
                    case 3:
                        if (ch == '/') {
                            state = 4;
                        } else if (ch == '*') {
                        } else {
                            state = 2;
                        }
                        break;
                    case 4:
                        break;
                }
            }
            cout << "annotation:" << buffer << endl;
        }
    }
}